

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

void SUNDlsMat_SetToZero(SUNDlsMat A)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  realtype **pprVar6;
  long lVar7;
  
  if (A->type == 2) {
    iVar1 = A->M;
    if (0 < (long)iVar1) {
      iVar3 = A->ml;
      iVar4 = A->mu;
      pprVar6 = A->cols;
      iVar5 = A->s_mu;
      lVar7 = 0;
      do {
        if (-1 < iVar3 + iVar4) {
          memset(pprVar6[lVar7] + ((long)iVar5 - (long)iVar4),0,(ulong)(iVar3 + iVar4 + 1) << 3);
        }
        lVar7 = lVar7 + 1;
      } while (iVar1 != lVar7);
    }
  }
  else if ((A->type == 1) && (iVar1 = A->N, 0 < (long)iVar1)) {
    pprVar6 = A->cols;
    uVar2 = A->M;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        memset(pprVar6[lVar7],0,(ulong)uVar2 << 3);
      }
      lVar7 = lVar7 + 1;
    } while (iVar1 != lVar7);
  }
  return;
}

Assistant:

void SUNDlsMat_SetToZero(SUNDlsMat A)
{
  sunindextype i, j, colSize;
  realtype *col_j;

  switch (A->type) {

  case SUNDIALS_DENSE:

    for (j=0; j<A->N; j++) {
      col_j = A->cols[j];
      for (i=0; i<A->M; i++)
        col_j[i] = ZERO;
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j=0; j<A->M; j++) {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i=0; i<colSize; i++)
        col_j[i] = ZERO;
    }

    break;

  }

}